

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

int connection_set_idle_timeout(CONNECTION_HANDLE connection,milliseconds idle_timeout)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (connection == (CONNECTION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x628;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x628;
    }
    pcVar4 = "NULL connection";
    iVar2 = 0x627;
  }
  else {
    if (connection->connection_state == CONNECTION_STATE_START) {
      connection->idle_timeout = idle_timeout;
      connection->field_0xe0 = connection->field_0xe0 | 2;
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x630;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x630;
    }
    pcVar4 = "Connection already open";
    iVar2 = 0x62f;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
            ,"connection_set_idle_timeout",iVar2,1,pcVar4);
  return iVar3;
}

Assistant:

int connection_set_idle_timeout(CONNECTION_HANDLE connection, milliseconds idle_timeout)
{
    int result;

    /* Codes_S_R_S_CONNECTION_01_191: [If connection is NULL, connection_set_idle_timeout shall fail and return a non-zero value.] */
    if (connection == NULL)
    {
        LogError("NULL connection");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_S_R_S_CONNECTION_01_158: [If connection_set_idle_timeout is called after the initial Open frame has been sent, it shall fail and return a non-zero value.] */
        if (connection->connection_state != CONNECTION_STATE_START)
        {
            LogError("Connection already open");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_S_R_S_CONNECTION_01_159: [connection_set_idle_timeout shall set the idle_timeout associated with a connection.] */
            /* Codes_S_R_S_CONNECTION_01_166: [If connection_set_idle_timeout fails, the previous idle_timeout setting shall be retained.] */
            connection->idle_timeout = idle_timeout;
            connection->idle_timeout_specified = true;

            /* Codes_S_R_S_CONNECTION_01_160: [On success connection_set_idle_timeout shall return 0.] */
            result = 0;
        }
    }

    return result;
}